

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_dofo(_garray *x,long npoints,t_float dcval,int nsin,t_float *vsin,int sineflag)

{
  float fVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  _array *p_Var5;
  double dVar6;
  double local_68;
  double sum;
  _array *array;
  int elemsize;
  int j;
  int i;
  int yonset;
  double fj;
  double phaseincr;
  double phase;
  t_float *ptStack_28;
  int sineflag_local;
  t_float *vsin_local;
  int nsin_local;
  t_float dcval_local;
  long npoints_local;
  _garray *x_local;
  
  phase._4_4_ = sineflag;
  ptStack_28 = vsin;
  vsin_local._0_4_ = nsin;
  vsin_local._4_4_ = dcval;
  _nsin_local = npoints;
  npoints_local = (long)x;
  p_Var5 = garray_getarray_floatonly(x,&j,(int *)&array);
  if (p_Var5 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",
             **(undefined8 **)(npoints_local + 0x28));
  }
  else {
    if (_nsin_local == 0) {
      _nsin_local = 0x200;
    }
    lVar3 = _nsin_local;
    iVar4 = ilog2((int)_nsin_local);
    if (lVar3 != 1 << ((byte)iVar4 & 0x1f)) {
      pcVar2 = p_Var5->a_templatesym->s_name;
      iVar4 = ilog2((int)_nsin_local);
      _nsin_local = (long)(1 << ((byte)iVar4 & 0x1f));
      post("%s: rounding to %d points",pcVar2);
    }
    garray_resize_long((_garray *)npoints_local,_nsin_local + 3);
    fj = 6.28318 / (double)_nsin_local;
    phaseincr = -fj;
    for (elemsize = 0; elemsize < p_Var5->a_n; elemsize = elemsize + 1) {
      local_68 = (double)vsin_local._4_4_;
      if (phase._4_4_ == 0) {
        _i = 0.0;
        for (array._4_4_ = 0; array._4_4_ < (int)vsin_local; array._4_4_ = array._4_4_ + 1) {
          fVar1 = ptStack_28[array._4_4_];
          dVar6 = cos(_i);
          local_68 = (double)fVar1 * dVar6 + local_68;
          _i = phaseincr + _i;
        }
      }
      else {
        _i = phaseincr;
        for (array._4_4_ = 0; array._4_4_ < (int)vsin_local; array._4_4_ = array._4_4_ + 1) {
          fVar1 = ptStack_28[array._4_4_];
          dVar6 = sin(_i);
          local_68 = (double)fVar1 * dVar6 + local_68;
          _i = phaseincr + _i;
        }
      }
      *(float *)(p_Var5->a_vec + (long)j * 4 + (long)((int)array * elemsize)) = (float)local_68;
      phaseincr = fj + phaseincr;
    }
    garray_redraw((_garray *)npoints_local);
  }
  return;
}

Assistant:

static void garray_dofo(t_garray *x, long npoints, t_float dcval,
    int nsin, t_float *vsin, int sineflag)
{
    double phase, phaseincr, fj;
    int yonset, i, j, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    if (npoints == 0)
        npoints = 512;  /* dunno what a good default would be... */
    if (npoints != (1 << ilog2((int)npoints)))
        post("%s: rounding to %d points", array->a_templatesym->s_name,
            (npoints = (1<<ilog2((int)npoints))));
    garray_resize_long(x, npoints + 3);
    phaseincr = 2. * 3.14159 / npoints;
    for (i = 0, phase = -phaseincr; i < array->a_n; i++, phase += phaseincr)
    {
        double sum = dcval;
        if (sineflag)
            for (j = 0, fj = phase; j < nsin; j++, fj += phase)
                sum += vsin[j] * sin(fj);
        else
            for (j = 0, fj = 0; j < nsin; j++, fj += phase)
                sum += vsin[j] * cos(fj);
        *((t_float *)((array->a_vec + elemsize * i)) + yonset)
            = sum;
    }
    garray_redraw(x);
}